

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O2

UBool __thiscall icu_63::UVector::retainAll(UVector *this,UVector *other)

{
  int32_t iVar1;
  uint index;
  UBool UVar2;
  
  index = this->count;
  UVar2 = '\0';
  while (0 < (int)index) {
    index = index - 1;
    iVar1 = indexOf(other,this->elements[index],0,'\0');
    if (iVar1 < 0) {
      removeElementAt(this,index);
      UVar2 = '\x01';
    }
  }
  return UVar2;
}

Assistant:

UBool UVector::retainAll(const UVector& other) {
    UBool changed = FALSE;
    for (int32_t j=size()-1; j>=0; --j) {
        int32_t i = other.indexOf(elements[j]);
        if (i < 0) {
            removeElementAt(j);
            changed = TRUE;
        }
    }
    return changed;
}